

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.h
# Opt level: O2

uint get_alignment_bits(MemOp memop)

{
  MemOp MVar1;
  
  MVar1 = memop & MO_ALIGN;
  if (MVar1 != MO_8) {
    if (MVar1 == MO_ALIGN) {
      return memop & MO_64;
    }
    MVar1 = MVar1 >> 4;
  }
  return MVar1;
}

Assistant:

static inline unsigned get_alignment_bits(MemOp memop)
{
    unsigned a = memop & MO_AMASK;

    if (a == MO_UNALN) {
        /* No alignment required.  */
        a = 0;
    } else if (a == MO_ALIGN) {
        /* A natural alignment requirement.  */
        a = memop & MO_SIZE;
    } else {
        /* A specific alignment requirement.  */
        a = a >> MO_ASHIFT;
    }

    /* The requested alignment cannot overlap the TLB flags.  */
    tcg_debug_assert((TLB_FLAGS_MASK & ((1 << a) - 1)) == 0);

    return a;
}